

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_> * __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::getSampleArgs
          (vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
           *__return_storage_ptr__,Generator *this)

{
  int iVar1;
  int *piVar2;
  Vector<float,_4> local_1b8;
  undefined1 auStack_1a8 [8];
  SampleArguments cur_1;
  int local_160;
  deUint32 lodNdx;
  deInt32 j_1;
  deInt32 i_1;
  float lodList [7];
  float fStack_134;
  undefined1 auStack_128 [8];
  SampleArguments cur;
  uint local_e0;
  int local_dc;
  deUint32 derivNdx;
  deInt32 j;
  deInt32 i;
  undefined1 local_c8 [8];
  anon_struct_32_2_66319ae3 derivativePairs [5];
  Generator *this_local;
  vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_> *args;
  
  std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>::vector
            (__return_storage_ptr__);
  if ((this->m_testCase->m_useDerivatives & 1U) == 0) {
    _j_1 = 0xbf000000bf800000;
    lodList[0] = 0.0;
    lodList[1] = 0.5;
    lodList[2] = 1.0;
    lodList[3] = 1.5;
    lodList[4] = 2.0;
    for (lodNdx = 0; piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,0),
        (int)lodNdx < *piVar2 * 2 + 1; lodNdx = lodNdx + 1) {
      for (local_160 = 0;
          piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,1),
          local_160 < *piVar2 * 2 + 1; local_160 = local_160 + 1) {
        for (cur_1.dRef = 0.0; (uint)cur_1.dRef < 7; cur_1.dRef = (float)((int)cur_1.dRef + 1)) {
          SampleArguments::SampleArguments((SampleArguments *)auStack_1a8);
          piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,0);
          iVar1 = *piVar2;
          piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,1);
          tcu::Vector<float,_4>::Vector
                    (&local_1b8,(float)(int)lodNdx / (float)(iVar1 * 2),
                     (float)local_160 / (float)(*piVar2 * 2),0.0,0.0);
          auStack_1a8._0_4_ = local_1b8.m_data[0];
          auStack_1a8._4_4_ = local_1b8.m_data[1];
          cur_1.coord.m_data[0] = local_1b8.m_data[2];
          cur_1.coord.m_data[1] = local_1b8.m_data[3];
          cur_1.dPdy.m_data[3] = (float)(&j_1)[(uint)cur_1.dRef];
          std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
          ::push_back(__return_storage_ptr__,(value_type *)auStack_1a8);
        }
      }
    }
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_c8,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[0].dPdx.m_data + 2),0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[0].dPdy.m_data + 2),1.0,1.0,1.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[1].dPdx.m_data + 2),1.0,1.0,1.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[1].dPdy.m_data + 2),0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[2].dPdx.m_data + 2),1.0,1.0,1.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[2].dPdy.m_data + 2),1.0,1.0,1.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[3].dPdx.m_data + 2),0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[3].dPdy.m_data + 2),2.0,2.0,2.0,0.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(derivativePairs[4].dPdx.m_data + 2),2.0,2.0,2.0,0.0);
    for (derivNdx = 0; piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,0),
        (int)derivNdx < *piVar2 * 2 + 1; derivNdx = derivNdx + 1) {
      for (local_dc = 0; piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,1)
          , local_dc < *piVar2 * 2 + 1; local_dc = local_dc + 1) {
        for (local_e0 = 0; local_e0 < 5; local_e0 = local_e0 + 1) {
          SampleArguments::SampleArguments((SampleArguments *)auStack_128);
          piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,0);
          iVar1 = *piVar2;
          piVar2 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,1);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(lodList + 6),(float)(int)derivNdx / (float)(iVar1 * 2),
                     (float)local_dc / (float)(*piVar2 * 2),0.0,0.0);
          auStack_128._0_4_ = lodList[6];
          auStack_128._4_4_ = fStack_134;
          cur.coord.m_data._8_8_ =
               *(undefined8 *)(derivativePairs[(ulong)local_e0 - 1].dPdy.m_data + 2);
          cur.dPdx.m_data._0_8_ = *(undefined8 *)derivativePairs[local_e0].dPdx.m_data;
          cur.dPdx.m_data._8_8_ = *(undefined8 *)(derivativePairs[local_e0].dPdx.m_data + 2);
          cur.dPdy.m_data._0_8_ = *(undefined8 *)derivativePairs[local_e0].dPdy.m_data;
          std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
          ::push_back(__return_storage_ptr__,(value_type *)auStack_128);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<SampleArguments> getSampleArgs (void) const
	{
		std::vector<SampleArguments> args;

		if (m_testCase->m_useDerivatives)
		{
			struct
			{
				Vec4 dPdx;
				Vec4 dPdy;
			}
			derivativePairs[] =
			{
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(2.0f, 2.0f, 2.0f, 0.0f), Vec4(2.0f, 2.0f, 2.0f, 0.0f)}
			};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
				    for (deUint32 derivNdx = 0; derivNdx < DE_LENGTH_OF_ARRAY(derivativePairs); ++derivNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.dPdx = derivativePairs[derivNdx].dPdx;
						cur.dPdy = derivativePairs[derivNdx].dPdy;

						args.push_back(cur);
					}
				}
			}
		}
		else
		{
			const float lodList[] = {-1.0, -0.5, 0.0, 0.5, 1.0, 1.5, 2.0};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
					for (deUint32 lodNdx = 0; lodNdx < DE_LENGTH_OF_ARRAY(lodList); ++lodNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.lod = lodList[lodNdx];

						args.push_back(cur);
					}
				}
			}
		}

		return args;
	}